

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

bool __thiscall Glucose::BoolOption::parse(BoolOption *this,char *str)

{
  bool bVar1;
  int iVar2;
  char *span;
  char *local_20;
  
  local_20 = str;
  bVar1 = match<char_const*>(&local_20,"-");
  if (bVar1) {
    bVar1 = match<char_const*>(&local_20,"no-");
    iVar2 = strcmp(local_20,(this->super_Option).name);
    if (iVar2 == 0) {
      this->value = !bVar1;
      return true;
    }
  }
  return false;
}

Assistant:

virtual bool parse(const char* str){
        const char* span = str; 
        
        if (match(span, "-")){
            bool b = !match(span, "no-");

            if (strcmp(span, name) == 0){
                value = b;
                return true; }
        }

        return false;
    }